

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

void duckdb::AllowedDirectoriesSetting::ResetGlobal(DatabaseInstance *db,DBConfig *config)

{
  InvalidInputException *this;
  __native_type local_6c0 [30];
  _Rb_tree_node_base local_210;
  size_t local_1f0;
  
  if ((config->options).enable_external_access != false) {
    DBConfig::DBConfig((DBConfig *)&local_6c0[0].__data);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(config->options).allowed_directories._M_t);
    if (local_210._M_parent != (_Base_ptr)0x0) {
      (config->options).allowed_directories._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_210._M_color;
      (config->options).allowed_directories._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_210._M_parent;
      (config->options).allowed_directories._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_210._M_left;
      (config->options).allowed_directories._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_210._M_right;
      (local_210._M_parent)->_M_parent =
           &(config->options).allowed_directories._M_t._M_impl.super__Rb_tree_header._M_header;
      (config->options).allowed_directories._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_1f0;
      local_210._M_parent = (_Base_ptr)0x0;
      local_1f0 = 0;
      local_210._M_left = &local_210;
      local_210._M_right = &local_210;
    }
    DBConfig::~DBConfig((DBConfig *)&local_6c0[0].__data);
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_6c0[0]._0_8_ = &local_6c0[0].__data.__kind;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6c0,
             "Cannot change allowed_directories when enable_external_access is disabled","");
  InvalidInputException::InvalidInputException(this,(string *)&local_6c0[0].__data);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void AllowedDirectoriesSetting::ResetGlobal(DatabaseInstance *db, DBConfig &config) {
	if (!config.options.enable_external_access) {
		throw InvalidInputException("Cannot change allowed_directories when enable_external_access is disabled");
	}
	config.options.allowed_directories = DBConfig().options.allowed_directories;
}